

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void __thiscall spdlog::file_event_handlers::~file_event_handlers(file_event_handlers *this)

{
  CLI::std::_Function_base::~_Function_base(&(this->after_close).super__Function_base);
  CLI::std::_Function_base::~_Function_base(&(this->before_close).super__Function_base);
  CLI::std::_Function_base::~_Function_base(&(this->after_open).super__Function_base);
  CLI::std::_Function_base::~_Function_base((_Function_base *)this);
  return;
}

Assistant:

file_event_handlers()
        : before_open(nullptr),
          after_open(nullptr),
          before_close(nullptr),
          after_close(nullptr) {}